

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_paramtype.cc
# Opt level: O0

Type * __thiscall ParameterizedType::DoClone(ParameterizedType *this)

{
  int iVar1;
  Type *type_id;
  undefined4 extraout_var;
  void *__child_stack;
  __fn *in_RSI;
  ExprList *in_RDI;
  void *in_R8;
  
  type_id = (Type *)operator_new(0x1a8);
  iVar1 = ID::clone((ID *)in_RDI[0x10].super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,in_RSI,__child_stack,
                    (int)type_id,in_R8);
  ParameterizedType((ParameterizedType *)CONCAT44(extraout_var,iVar1),(ID *)type_id,in_RDI);
  return type_id;
}

Assistant:

Type* ParameterizedType::DoClone() const
	{
	return new ParameterizedType(type_id_->clone(), args_);
	}